

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

void ma_spatializer_set_min_distance(ma_spatializer *pSpatializer,float minDistance)

{
  if (pSpatializer != (ma_spatializer *)0x0) {
    LOCK();
    pSpatializer->minDistance = minDistance;
    UNLOCK();
  }
  return;
}

Assistant:

MA_API void ma_spatializer_set_min_distance(ma_spatializer* pSpatializer, float minDistance)
{
    if (pSpatializer == NULL) {
        return;
    }

    ma_atomic_exchange_f32(&pSpatializer->minDistance, minDistance);
}